

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_TestFileVsMessageScope_Test::
~GeneratedMessageTest_TestFileVsMessageScope_Test
          (GeneratedMessageTest_TestFileVsMessageScope_Test *this)

{
  GeneratedMessageTest_TestFileVsMessageScope_Test *this_local;
  
  ~GeneratedMessageTest_TestFileVsMessageScope_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestFileVsMessageScope) {
  // Special names at message scope are mangled,
  int v [[maybe_unused]] =
      proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::TestConflictingSymbolNames::
                            BadKnownNamesValues::unknown_fields_);
  // But not at file scope.
  v = proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::unknown_fields);
}